

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRr.c
# Opt level: O0

void Abc_NtkRRSimulateStart(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aVar6;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aVar7;
  uint local_48;
  uint local_44;
  int local_28;
  int i;
  uint uData1;
  uint uData0;
  uint uData;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  pAVar4 = Abc_AigConst1(pNtk);
  pAVar4->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0xffffffff;
  for (local_28 = 0; iVar1 = Abc_NtkCiNum(pNtk), local_28 < iVar1; local_28 = local_28 + 1) {
    pAVar4 = Abc_NtkCi(pNtk,local_28);
    iVar1 = rand();
    iVar2 = rand();
    uVar3 = rand();
    aVar6._4_4_ = 0;
    aVar6.iData = iVar1 << 0x18 ^ iVar2 << 0xc ^ uVar3;
    pAVar4->field_5 = aVar6;
  }
  local_28 = 0;
  do {
    iVar1 = Vec_PtrSize(pNtk->vObjs);
    if (iVar1 <= local_28) {
      return;
    }
    pAVar4 = Abc_NtkObj(pNtk,local_28);
    if (((pAVar4 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar4), iVar1 != 0)) &&
       (local_28 != 0)) {
      pAVar5 = Abc_ObjFanin0(pAVar4);
      local_44 = (pAVar5->field_5).iData;
      pAVar5 = Abc_ObjFanin1(pAVar4);
      local_48 = (pAVar5->field_5).iData;
      iVar1 = Abc_ObjFaninC0(pAVar4);
      if (iVar1 != 0) {
        local_44 = local_44 ^ 0xffffffff;
      }
      iVar1 = Abc_ObjFaninC1(pAVar4);
      if (iVar1 != 0) {
        local_48 = local_48 ^ 0xffffffff;
      }
      if ((pAVar4->field_5).pData != (void *)0x0) {
        __assert_fail("pObj->pData == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRr.c"
                      ,0x2e8,"void Abc_NtkRRSimulateStart(Abc_Ntk_t *)");
      }
      aVar7._4_4_ = 0;
      aVar7.iData = local_48 & local_44;
      pAVar4->field_5 = aVar7;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

void Abc_NtkRRSimulateStart( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    unsigned uData, uData0, uData1;
    int i;
    Abc_AigConst1(pNtk)->pData = (void *)~((unsigned)0);
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pData = (void *)(ABC_PTRUINT_T)SIM_RANDOM_UNSIGNED;
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( i == 0 ) continue;
        uData0 = (unsigned)(ABC_PTRUINT_T)Abc_ObjFanin0(pObj)->pData;
        uData1 = (unsigned)(ABC_PTRUINT_T)Abc_ObjFanin1(pObj)->pData;
        uData  = Abc_ObjFaninC0(pObj)? ~uData0 : uData0;
        uData &= Abc_ObjFaninC1(pObj)? ~uData1 : uData1;
        assert( pObj->pData == NULL );
        pObj->pData = (void *)(ABC_PTRUINT_T)uData;
    }
}